

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

EnumTypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EnumTypeSyntax,slang::parsing::Token,slang::syntax::DataTypeSyntax*,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>&>
          (BumpAllocator *this,Token *args,DataTypeSyntax **args_1,Token *args_2,
          SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_3,Token *args_4,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *args_5)

{
  Token openBrace;
  Token keyword;
  EnumTypeSyntax *pEVar1;
  EnumTypeSyntax *in_RCX;
  undefined8 in_RDX;
  Info *in_RSI;
  undefined8 in_RDI;
  DataTypeSyntax *in_R8;
  Info *unaff_retaddr;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *in_stack_00000010;
  undefined1 in_stack_00000018 [16];
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_00000028;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  pEVar1 = (EnumTypeSyntax *)
           allocate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  keyword.info = unaff_retaddr;
  keyword.kind = (short)in_RDI;
  keyword._2_1_ = (char)((ulong)in_RDI >> 0x10);
  keyword.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  keyword.rawLen = (int)((ulong)in_RDI >> 0x20);
  openBrace.info = in_RSI;
  openBrace.kind = (short)in_RDX;
  openBrace._2_1_ = (char)((ulong)in_RDX >> 0x10);
  openBrace.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  openBrace.rawLen = (int)((ulong)in_RDX >> 0x20);
  slang::syntax::EnumTypeSyntax::EnumTypeSyntax
            (in_RCX,keyword,in_R8,openBrace,in_stack_00000010,(Token)in_stack_00000018,
             in_stack_00000028);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }